

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

void idct64_stage9_avx2(__m256i *u,__m256i *cospim32,__m256i *cospi32,__m256i *clamp_lo,
                       __m256i *clamp_hi,__m256i *rnding,int bit)

{
  undefined1 auVar1 [32];
  __m256i alVar2;
  __m256i alVar3;
  undefined1 auVar4 [32];
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  undefined1 auVar9 [32];
  __m256i *palVar10;
  ulong uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  
  palVar10 = u;
  for (lVar12 = 0x1e0; lVar12 != 0xe0; lVar12 = lVar12 + -0x20) {
    auVar1 = *(undefined1 (*) [32])((long)*u + lVar12);
    auVar4 = vpaddd_avx2(auVar1,(undefined1  [32])*palVar10);
    auVar9 = vpsubd_avx2((undefined1  [32])*palVar10,auVar1);
    auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
    alVar5 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    auVar1 = vpmaxsd_avx2(auVar9,(undefined1  [32])*clamp_lo);
    auVar1 = vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    *palVar10 = alVar5;
    *(undefined1 (*) [32])((long)*u + lVar12) = auVar1;
    palVar10 = palVar10 + 1;
  }
  alVar5 = *cospim32;
  auVar1 = vpmulld_avx2((undefined1  [32])u[0x14],(undefined1  [32])alVar5);
  alVar2 = *cospi32;
  auVar4 = vpmulld_avx2((undefined1  [32])u[0x1b],(undefined1  [32])alVar2);
  auVar1 = vpaddd_avx2(auVar4,auVar1);
  alVar3 = *rnding;
  auVar1 = vpaddd_avx2((undefined1  [32])alVar3,auVar1);
  alVar6 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  auVar1 = vpmulld_avx2((undefined1  [32])u[0x15],(undefined1  [32])alVar5);
  auVar4 = vpmulld_avx2((undefined1  [32])u[0x1a],(undefined1  [32])alVar2);
  auVar1 = vpaddd_avx2((undefined1  [32])alVar3,auVar1);
  auVar1 = vpaddd_avx2(auVar4,auVar1);
  alVar7 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  auVar1 = vpmulld_avx2((undefined1  [32])u[0x16],(undefined1  [32])alVar5);
  auVar4 = vpmulld_avx2((undefined1  [32])u[0x19],(undefined1  [32])alVar2);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])alVar3);
  auVar1 = vpaddd_avx2(auVar1,auVar4);
  auVar13 = ZEXT416((uint)bit);
  alVar8 = (__m256i)vpsrad_avx2(auVar1,auVar13);
  auVar1 = vpmulld_avx2((undefined1  [32])u[0x17],(undefined1  [32])alVar5);
  auVar4 = vpmulld_avx2((undefined1  [32])u[0x18],(undefined1  [32])alVar2);
  auVar1 = vpaddd_avx2((undefined1  [32])alVar3,auVar1);
  auVar1 = vpaddd_avx2(auVar4,auVar1);
  alVar5 = (__m256i)vpsrad_avx2(auVar1,auVar13);
  auVar1 = vpaddd_avx2((undefined1  [32])u[0x18],(undefined1  [32])u[0x17]);
  auVar1 = vpmulld_avx2(auVar1,(undefined1  [32])alVar2);
  auVar1 = vpaddd_avx2((undefined1  [32])alVar3,auVar1);
  alVar2 = (__m256i)vpsrad_avx2(auVar1,auVar13);
  u[0x18] = alVar2;
  auVar1 = vpaddd_avx2((undefined1  [32])u[0x19],(undefined1  [32])u[0x16]);
  auVar1 = vpmulld_avx2(auVar1,(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rnding);
  alVar2 = (__m256i)vpsrad_avx2(auVar1,auVar13);
  u[0x19] = alVar2;
  auVar1 = vpaddd_avx2((undefined1  [32])u[0x1a],(undefined1  [32])u[0x15]);
  auVar1 = vpmulld_avx2(auVar1,(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rnding);
  alVar2 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  u[0x1a] = alVar2;
  auVar1 = vpaddd_avx2((undefined1  [32])u[0x1b],(undefined1  [32])u[0x14]);
  auVar1 = vpmulld_avx2(auVar1,(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rnding);
  alVar2 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  u[0x1b] = alVar2;
  u[0x14] = alVar6;
  u[0x15] = alVar7;
  u[0x16] = alVar8;
  u[0x17] = alVar5;
  palVar10 = u + 0x20;
  for (uVar11 = 0x20; uVar11 != 0x28; uVar11 = uVar11 + 1) {
    auVar1 = vpaddd_avx2((undefined1  [32])u[uVar11 ^ 0xf],(undefined1  [32])*palVar10);
    auVar4 = vpsubd_avx2((undefined1  [32])*palVar10,(undefined1  [32])u[uVar11 ^ 0xf]);
    auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
    alVar5 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
    alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    *palVar10 = alVar5;
    u[uVar11 ^ 0xf] = alVar2;
    palVar10 = palVar10 + 1;
  }
  palVar10 = u + 0x30;
  for (uVar11 = 0x30; uVar11 != 0x38; uVar11 = uVar11 + 1) {
    auVar1 = vpaddd_avx2((undefined1  [32])*palVar10,(undefined1  [32])u[uVar11 ^ 0xf]);
    auVar4 = vpsubd_avx2((undefined1  [32])u[uVar11 ^ 0xf],(undefined1  [32])*palVar10);
    auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
    alVar5 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
    alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    u[uVar11 ^ 0xf] = alVar5;
    *palVar10 = alVar2;
    palVar10 = palVar10 + 1;
  }
  return;
}

Assistant:

static inline void idct64_stage9_avx2(__m256i *u, const __m256i *cospim32,
                                      const __m256i *cospi32,
                                      const __m256i *clamp_lo,
                                      const __m256i *clamp_hi,
                                      const __m256i *rnding, int bit) {
  int i;
  __m256i temp1, temp2, temp3, temp4;
  for (i = 0; i < 8; ++i) {
    addsub_avx2(u[i], u[15 - i], &u[i], &u[15 - i], clamp_lo, clamp_hi);
  }

  temp1 = half_btf_avx2(cospim32, &u[20], cospi32, &u[27], rnding, bit);
  temp2 = half_btf_avx2(cospim32, &u[21], cospi32, &u[26], rnding, bit);
  temp3 = half_btf_avx2(cospim32, &u[22], cospi32, &u[25], rnding, bit);
  temp4 = half_btf_avx2(cospim32, &u[23], cospi32, &u[24], rnding, bit);
  u[24] = half_btf_avx2(cospi32, &u[23], cospi32, &u[24], rnding, bit);
  u[25] = half_btf_avx2(cospi32, &u[22], cospi32, &u[25], rnding, bit);
  u[26] = half_btf_avx2(cospi32, &u[21], cospi32, &u[26], rnding, bit);
  u[27] = half_btf_avx2(cospi32, &u[20], cospi32, &u[27], rnding, bit);
  u[20] = temp1;
  u[21] = temp2;
  u[22] = temp3;
  u[23] = temp4;
  for (i = 32; i < 40; i++) {
    addsub_avx2(u[i], u[i ^ 15], &u[i], &u[i ^ 15], clamp_lo, clamp_hi);
  }

  for (i = 48; i < 56; i++) {
    addsub_avx2(u[i ^ 15], u[i], &u[i ^ 15], &u[i], clamp_lo, clamp_hi);
  }
}